

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O3

void Gia_MiniAigSuperGates_rec(Mini_Aig_t *p,int iObj,Vec_Int_t *vRes,Vec_Int_t *vMap)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = Mini_AigNodeIsPi(p,iObj);
  if (iVar1 == 0) {
    do {
      uVar2 = Mini_AigNodeFanin0(p,iObj);
      uVar3 = Mini_AigNodeFanin1(p,iObj);
      if ((int)uVar2 < 0) {
LAB_0078a5fc:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      if ((uVar2 & 1) != 0) {
        __assert_fail("!Abc_LitIsCompl(iFan0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                      ,0x336,
                      "void Gia_MiniAigSuperGates_rec(Mini_Aig_t *, int, Vec_Int_t *, Vec_Int_t *)")
        ;
      }
      if ((int)uVar3 < 0) goto LAB_0078a5fc;
      if ((uVar3 & 1) != 0) {
        __assert_fail("!Abc_LitIsCompl(iFan1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                      ,0x337,
                      "void Gia_MiniAigSuperGates_rec(Mini_Aig_t *, int, Vec_Int_t *, Vec_Int_t *)")
        ;
      }
      Gia_MiniAigSuperGates_rec(p,uVar2 >> 1,vRes,vMap);
      iObj = uVar3 >> 1;
      iVar1 = Mini_AigNodeIsPi(p,iObj);
    } while (iVar1 == 0);
  }
  else if (iObj < 0) goto LAB_0078a659;
  if (iObj < vMap->nSize) {
    if (vMap->pArray[(uint)iObj] < 0) {
      __assert_fail("Vec_IntEntry(vMap, iObj) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                    ,0x330,
                    "void Gia_MiniAigSuperGates_rec(Mini_Aig_t *, int, Vec_Int_t *, Vec_Int_t *)");
    }
    Vec_IntPush(vRes,vMap->pArray[(uint)iObj]);
    return;
  }
LAB_0078a659:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_MiniAigSuperGates_rec( Mini_Aig_t * p, int iObj, Vec_Int_t * vRes, Vec_Int_t * vMap )
{
    int iFan0, iFan1;
    if ( Mini_AigNodeIsPi(p, iObj) )
    {
        assert( Vec_IntEntry(vMap, iObj) >= 0 );
        Vec_IntPush( vRes, Vec_IntEntry(vMap, iObj) );
        return;
    }
    iFan0 = Mini_AigNodeFanin0( p, iObj );
    iFan1 = Mini_AigNodeFanin1( p, iObj );
    assert( !Abc_LitIsCompl(iFan0) );
    assert( !Abc_LitIsCompl(iFan1) );
    Gia_MiniAigSuperGates_rec( p, Abc_Lit2Var(iFan0), vRes, vMap );
    Gia_MiniAigSuperGates_rec( p, Abc_Lit2Var(iFan1), vRes, vMap );
}